

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XMLReader::skipSpaces(XMLReader *this,bool *skippedSomething,bool inDecl)

{
  XMLSize_t XVar1;
  bool bVar2;
  XMLCh local_24;
  byte local_21;
  XMLCh curCh;
  bool *pbStack_20;
  bool inDecl_local;
  bool *skippedSomething_local;
  XMLReader *this_local;
  
  local_21 = inDecl;
  pbStack_20 = skippedSomething;
  skippedSomething_local = (bool *)this;
  do {
    while (this->fCharIndex < this->fCharsAvail) {
      bVar2 = isWhitespace(this,this->fCharBuf[this->fCharIndex]);
      if (!bVar2) {
        return true;
      }
      XVar1 = this->fCharIndex;
      this->fCharIndex = XVar1 + 1;
      local_24 = this->fCharBuf[XVar1];
      *pbStack_20 = true;
      if ((local_24 & 6U) == 0) {
        this->fCurCol = this->fCurCol + 1;
      }
      else {
        handleEOL(this,&local_24,(bool)(local_21 & 1));
      }
    }
    bVar2 = refreshCharBuffer(this);
  } while (bVar2);
  return false;
}

Assistant:

bool XMLReader::skipSpaces(bool& skippedSomething, bool inDecl)
{
    //  DO NOT set the skippedSomething to 'false', but change it to be 'true' only

    //  We enter a loop where we skip over spaces until we hit the end of
    //  this reader or a non-space value. The return indicates whether we
    //  hit the non-space (true) or the end (false).
    do
    {
        // Loop through the current chars in the buffer
        while (fCharIndex < fCharsAvail)
        {
            //  See if its a white space char. If so, then process it. Else
            //  we've hit a non-space and need to return.
            if (isWhitespace(fCharBuf[fCharIndex]))
            {
                // Get the current char out of the buffer and eat it
                XMLCh curCh = fCharBuf[fCharIndex++];
                skippedSomething = true;
                //
                //  'curCh' is a whitespace(x20|x9|xD|xA), so we only can have
                //  end-of-line combinations with a leading chCR(xD) or chLF(xA)
                //
                //  100000 x20
                //  001001 x9
                //  001010 chLF
                //  001101 chCR
                //  -----------
                //  000110 == (chCR|chLF) & ~(0x9|0x20)
                //
                //  if the result of the logical-& operation is
                //  true  : 'curCh' must be xA  or xD
                //  false : 'curCh' must be x20 or x9
                //
                if ( ( curCh & (chCR|chLF) & ~(0x9|0x20) ) == 0 )
                {
                    fCurCol++;
                } else
                {
                    handleEOL(curCh, inDecl);
                }
            }
            else
                return true;
        }

        //  We've eaten up the current buffer, so lets try to reload it. If
        //  we don't get anything new, then break out. If we do, then we go
        //  back to the top to keep getting spaces.
    } while(refreshCharBuffer());

    // We never hit any non-space and ate up the whole reader
    return false;
}